

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pa_unix_util.c
# Opt level: O0

PaError PaUnixThread_New(PaUnixThread *self,_func_void_ptr_void_ptr *threadFunc,void *threadArg,
                        PaTime waitForChild,int rtSched)

{
  __syscall_slong_t _Var1;
  int iVar2;
  double dVar3;
  bool local_b1;
  PaTime now;
  undefined1 auStack_90 [4];
  int res;
  timespec ts;
  PaTime till;
  int local_70;
  sched_param spm;
  int policy;
  int started;
  pthread_attr_t attr;
  PaError result;
  int rtSched_local;
  PaTime waitForChild_local;
  void *threadArg_local;
  _func_void_ptr_void_ptr *threadFunc_local;
  PaUnixThread *self_local;
  
  attr._48_4_ = 0;
  spm.sched_priority = 0;
  attr._52_4_ = rtSched;
  _result = waitForChild;
  waitForChild_local = (PaTime)threadArg;
  threadArg_local = threadFunc;
  threadFunc_local = (_func_void_ptr_void_ptr *)self;
  memset(self,0,0x78);
  PaUnixMutex_Initialize((PaUnixMutex *)(threadFunc_local + 0x18));
  paUtilErr_ = pthread_cond_init((pthread_cond_t *)(threadFunc_local + 0x40),
                                 (pthread_condattr_t *)0x0);
  if (paUtilErr_ != 0) {
    __assert_fail("0 == paUtilErr_",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c"
                  ,0x115,
                  "PaError PaUnixThread_New(PaUnixThread *, void *(*)(void *), void *, PaTime, int)"
                 );
  }
  *(uint *)(threadFunc_local + 8) = (uint)(_result != 0.0);
  iVar2 = pthread_attr_init((pthread_attr_t *)&policy);
  if (iVar2 == 0) {
    iVar2 = pthread_attr_setscope((pthread_attr_t *)&policy,0);
    if (iVar2 == 0) {
      iVar2 = pthread_create((pthread_t *)threadFunc_local,(pthread_attr_t *)&policy,
                             (__start_routine *)threadArg_local,(void *)waitForChild_local);
      if (iVar2 == 0) {
        spm.sched_priority = 1;
        if (attr._52_4_ != 0) {
          paUtilErr_ = BoostPriority((PaUnixThread *)threadFunc_local);
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'BoostPriority( self )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 345\n"
                             );
            attr._48_4_ = paUtilErr_;
            goto LAB_0011290f;
          }
          pthread_getschedparam
                    (*(pthread_t *)threadFunc_local,&local_70,(sched_param *)((long)&till + 4));
        }
        if (*(int *)(threadFunc_local + 8) == 0) {
          return attr._48_4_;
        }
        now._4_4_ = 0;
        paUtilErr_ = PaUnixMutex_Lock((PaUnixMutex *)(threadFunc_local + 0x18));
        if (paUtilErr_ < 0) {
          PaUtil_DebugPrint(
                           "Expression \'PaUnixMutex_Lock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 361\n"
                           );
          attr._48_4_ = paUtilErr_;
        }
        else {
          dVar3 = PaUtil_GetTime();
          ts.tv_nsec = (__syscall_slong_t)(dVar3 + _result);
          while (*(int *)(threadFunc_local + 8) != 0 && now._4_4_ == 0) {
            if (_result <= 0.0) {
              now._4_4_ = pthread_cond_wait((pthread_cond_t *)(threadFunc_local + 0x40),
                                            (pthread_mutex_t *)(threadFunc_local + 0x18));
            }
            else {
              dVar3 = floor((double)ts.tv_nsec);
              _Var1 = ts.tv_nsec;
              _auStack_90 = (long)dVar3;
              dVar3 = floor((double)ts.tv_nsec);
              ts.tv_sec = (__time_t)(((double)_Var1 - dVar3) * 1000000000.0);
              now._4_4_ = pthread_cond_timedwait
                                    ((pthread_cond_t *)(threadFunc_local + 0x40),
                                     (pthread_mutex_t *)(threadFunc_local + 0x18),
                                     (timespec *)auStack_90);
            }
          }
          paUtilErr_ = PaUnixMutex_Unlock((PaUnixMutex *)(threadFunc_local + 0x18));
          if (paUtilErr_ < 0) {
            PaUtil_DebugPrint(
                             "Expression \'PaUnixMutex_Unlock( &self->mtx )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 381\n"
                             );
            attr._48_4_ = paUtilErr_;
          }
          else {
            local_b1 = now._4_4_ == 0 || now._4_4_ == 0x6e;
            if (local_b1) {
              if (now._4_4_ != 0x6e) {
                return attr._48_4_;
              }
              paUtilErr_ = -0x2703;
              PaUtil_DebugPrint(
                               "Expression \'paTimedOut\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 387\n"
                               );
              attr._48_4_ = paUtilErr_;
            }
            else {
              PaUtil_DebugPrint(
                               "Expression \'!res || ETIMEDOUT == res\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 383\n"
                               );
              attr._48_4_ = 0xffffd8fe;
            }
          }
        }
      }
      else {
        PaUtil_DebugPrint(
                         "Expression \'!pthread_create( &self->thread, &attr, threadFunc, threadArg )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 305\n"
                         );
        attr._48_4_ = 0xffffd8fe;
      }
    }
    else {
      PaUtil_DebugPrint(
                       "Expression \'!pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 303\n"
                       );
      attr._48_4_ = 0xffffd8fe;
    }
  }
  else {
    PaUtil_DebugPrint(
                     "Expression \'!pthread_attr_init( &attr )\' failed in \'/workspace/llm4binary/github/license_all_cmakelists_1510/jitsi[P]portaudio/src/os/unix/pa_unix_util.c\', line: 301\n"
                     );
    attr._48_4_ = 0xffffd8fe;
  }
LAB_0011290f:
  if (spm.sched_priority != 0) {
    PaUnixThread_Terminate((PaUnixThread *)threadFunc_local,0,(PaError *)0x0);
  }
  return attr._48_4_;
}

Assistant:

PaError PaUnixThread_New( PaUnixThread* self, void* (*threadFunc)( void* ), void* threadArg, PaTime waitForChild,
        int rtSched )
{
    PaError result = paNoError;
    pthread_attr_t attr;
    int started = 0;

    memset( self, 0, sizeof (PaUnixThread) );
    PaUnixMutex_Initialize( &self->mtx );
    PA_ASSERT_CALL( pthread_cond_init( &self->cond, NULL ), 0 );

    self->parentWaiting = 0 != waitForChild;

    /* Spawn thread */

/* Temporarily disabled since we should test during configuration for presence of required mman.h header */
#if 0
#if defined _POSIX_MEMLOCK && (_POSIX_MEMLOCK != -1)
    if( rtSched )
    {
        if( mlockall( MCL_CURRENT | MCL_FUTURE ) < 0 )
        {
            int savedErrno = errno;             /* In case errno gets overwritten */
            assert( savedErrno != EINVAL );     /* Most likely a programmer error */
            PA_UNLESS( (savedErrno == EPERM), paInternalError );
            PA_DEBUG(( "%s: Failed locking memory\n", __FUNCTION__ ));
        }
        else
            PA_DEBUG(( "%s: Successfully locked memory\n", __FUNCTION__ ));
    }
#endif
#endif

    PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
    /* Priority relative to other processes */
    PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );

    PA_UNLESS( !pthread_create( &self->thread, &attr, threadFunc, threadArg ), paInternalError );
    started = 1;

    if( rtSched )
    {
#if 0
        if( self->useWatchdog )
        {
            int err;
            struct sched_param wdSpm = { 0 };
            /* Launch watchdog, watchdog sets callback thread priority */
            int prio = PA_MIN( self->rtPrio + 4, sched_get_priority_max( SCHED_FIFO ) );
            wdSpm.sched_priority = prio;

            PA_UNLESS( !pthread_attr_init( &attr ), paInternalError );
            PA_UNLESS( !pthread_attr_setinheritsched( &attr, PTHREAD_EXPLICIT_SCHED ), paInternalError );
            PA_UNLESS( !pthread_attr_setscope( &attr, PTHREAD_SCOPE_SYSTEM ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedpolicy( &attr, SCHED_FIFO ), paInternalError );
            PA_UNLESS( !pthread_attr_setschedparam( &attr, &wdSpm ), paInternalError );
            if( (err = pthread_create( &self->watchdogThread, &attr, &WatchdogFunc, self )) )
            {
                PA_UNLESS( err == EPERM, paInternalError );
                /* Permission error, go on without realtime privileges */
                PA_DEBUG(( "Failed bumping priority\n" ));
            }
            else
            {
                int policy;
                self->watchdogRunning = 1;
                PA_ENSURE_SYSTEM( pthread_getschedparam( self->watchdogThread, &policy, &wdSpm ), 0 );
                /* Check if priority is right, policy could potentially differ from SCHED_FIFO (but that's alright) */
                if( wdSpm.sched_priority != prio )
                {
                    PA_DEBUG(( "Watchdog priority not set correctly (%d)\n", wdSpm.sched_priority ));
                    PA_ENSURE( paInternalError );
                }
            }
        }
        else
#endif
            PA_ENSURE( BoostPriority( self ) );

        {
            int policy;
            struct sched_param spm;
            pthread_getschedparam(self->thread, &policy, &spm);
        }
    }

    if( self->parentWaiting )
    {
        PaTime till;
        struct timespec ts;
        int res = 0;
        PaTime now;

        PA_ENSURE( PaUnixMutex_Lock( &self->mtx ) );

        /* Wait for stream to be started */
        now = PaUtil_GetTime();
        till = now + waitForChild;

        while( self->parentWaiting && !res )
        {
            if( waitForChild > 0 )
            {
                ts.tv_sec = (time_t) floor( till );
                ts.tv_nsec = (long) ((till - floor( till )) * 1e9);
                res = pthread_cond_timedwait( &self->cond, &self->mtx.mtx, &ts );
            }
            else
            {
                res = pthread_cond_wait( &self->cond, &self->mtx.mtx );
            }
        }

        PA_ENSURE( PaUnixMutex_Unlock( &self->mtx ) );

        PA_UNLESS( !res || ETIMEDOUT == res, paInternalError );
        PA_DEBUG(( "%s: Waited for %g seconds for stream to start\n", __FUNCTION__, PaUtil_GetTime() - now ));
        if( ETIMEDOUT == res )
        {
            PA_ENSURE( paTimedOut );
        }
    }

end:
    return result;
error:
    if( started )
    {
        PaUnixThread_Terminate( self, 0, NULL );
    }

    goto end;
}